

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseInlineExports(WastParser *this,ModuleFieldList *fields,ExternalKind kind)

{
  ModuleField *pMVar1;
  char *pcVar2;
  bool bVar3;
  Result RVar4;
  ModuleFieldList *pMVar5;
  pointer *__ptr;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> field;
  Token local_98;
  Location local_58;
  
  do {
    bVar3 = PeekMatchLpar(this,Export);
    if (!bVar3) {
      return (Result)Ok;
    }
    RVar4 = Expect(this,Lpar);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    GetToken(&local_98,this);
    local_58.field_1.field_1.offset = local_98.loc.field_1.field_1.offset;
    local_58.field_1._8_8_ = local_98.loc.field_1._8_8_;
    local_58.filename.data_ = local_98.loc.filename.data_;
    local_58.filename.size_ = local_98.loc.filename.size_;
    MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_98,&local_58);
    *(ExternalKind *)
     &(((ModuleField *)((long)local_98.loc.filename.data_ + 0x40))->loc).filename.size_ = kind;
    RVar4 = Expect(this,Export);
    if (((RVar4.enum_ == Error) ||
        (RVar4 = ParseQuotedText(this,(string *)((long)local_98.loc.filename.data_ + 0x40)),
        RVar4.enum_ == Error)) ||
       (RVar4 = Expect(this,Rpar), pcVar2 = local_98.loc.filename.data_, RVar4.enum_ == Error)) {
      bVar3 = false;
    }
    else {
      local_98.loc.filename.data_ = (char *)0x0;
      if ((((intrusive_list_base<wabt::ModuleField> *)((long)pcVar2 + 8))->prev_ !=
           (ModuleField *)0x0) ||
         (((intrusive_list_base<wabt::ModuleField> *)((long)pcVar2 + 8))->next_ !=
          (ModuleField *)0x0)) {
        __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                      ,0x1bf,
                      "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                     );
      }
      pMVar1 = fields->last_;
      pMVar5 = fields;
      if (pMVar1 != (ModuleField *)0x0) {
        ((intrusive_list_base<wabt::ModuleField> *)((long)pcVar2 + 8))->prev_ = pMVar1;
        pMVar5 = (ModuleFieldList *)&pMVar1->super_intrusive_list_base<wabt::ModuleField>;
      }
      pMVar5->first_ = (ModuleField *)pcVar2;
      fields->last_ = (ModuleField *)pcVar2;
      fields->size_ = fields->size_ + 1;
      bVar3 = true;
    }
    if ((ModuleField *)local_98.loc.filename.data_ != (ModuleField *)0x0) {
      (*(*(_func_int ***)local_98.loc.filename.data_)[1])();
    }
  } while (bVar3);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInlineExports(ModuleFieldList* fields,
                                      ExternalKind kind) {
  WABT_TRACE(ParseInlineExports);
  while (PeekMatchLpar(TokenType::Export)) {
    EXPECT(Lpar);
    auto field = MakeUnique<ExportModuleField>(GetLocation());
    field->export_.kind = kind;
    EXPECT(Export);
    CHECK_RESULT(ParseQuotedText(&field->export_.name));
    EXPECT(Rpar);
    fields->push_back(std::move(field));
  }
  return Result::Ok;
}